

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void Transform(uint32_t *s,uint32_t *chunk,size_t blocks)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint w;
  uint uVar14;
  uint w_00;
  bool bVar15;
  uint32_t local_150;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  ulong local_130;
  uint32_t local_124;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uint *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_38 = blocks;
  local_60 = s;
  if (use_optimized_transform == '\x01') {
    TransformSSE4(s,chunk,blocks);
    return;
  }
  while (bVar15 = local_38 != 0, local_38 = local_38 - 1, bVar15) {
    uVar1 = *local_60;
    uVar2 = local_60[1];
    c = local_60[2];
    d = local_60[3];
    uVar12 = local_60[4];
    uVar11 = local_60[5];
    local_48 = (ulong)uVar11;
    g = local_60[6];
    local_40 = (ulong)g;
    local_150 = local_60[7];
    uVar7 = *chunk;
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    local_b8 = (ulong)uVar7;
    f = uVar11;
    e = uVar12;
    b = uVar2;
    a = uVar1;
    local_e8 = chunk;
    local_70 = uVar2;
    local_6c = c;
    local_68 = d;
    local_64 = local_150;
    Round(uVar1,uVar2,c,&d,uVar12,uVar11,g,&local_150,0x428a2f98,uVar7);
    uVar10 = d;
    uVar3 = local_150;
    uVar7 = local_e8[1];
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    local_108 = (ulong)uVar7;
    local_74 = uVar1;
    local_50 = (ulong)uVar12;
    Round(local_150,uVar1,uVar2,&c,d,uVar12,uVar11,&g,0x71374491,uVar7);
    uVar9 = c;
    uVar2 = g;
    uVar11 = local_e8[2];
    uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    local_100 = (ulong)uVar11;
    Round(g,uVar3,uVar1,&b,c,uVar10,uVar12,&f,0xb5c0fbcf,uVar11);
    uVar5 = b;
    uVar4 = f;
    uVar12 = local_e8[3];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_f0 = (ulong)uVar12;
    Round(f,uVar2,uVar3,&a,b,uVar9,uVar10,&e,0xe9b5dba5,uVar12);
    uVar6 = a;
    uVar3 = e;
    uVar12 = local_e8[4];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_d8 = (ulong)uVar12;
    Round(e,uVar4,uVar2,&local_150,a,uVar5,uVar9,&d,0x3956c25b,uVar12);
    uVar10 = d;
    uVar1 = local_150;
    uVar12 = local_e8[5];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_c0 = (ulong)uVar12;
    Round(d,uVar3,uVar4,&g,local_150,uVar6,uVar5,&c,0x59f111f1,uVar12);
    uVar9 = c;
    uVar2 = g;
    uVar12 = local_e8[6];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_f8 = (ulong)uVar12;
    Round(c,uVar10,uVar3,&f,g,uVar1,uVar6,&b,0x923f82a4,uVar12);
    uVar5 = b;
    uVar3 = f;
    uVar12 = local_e8[7];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_e0 = (ulong)uVar12;
    Round(b,uVar9,uVar10,&e,f,uVar2,uVar1,&a,0xab1c5ed5,uVar12);
    uVar6 = a;
    uVar4 = e;
    uVar12 = local_e8[8];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_d0 = (ulong)uVar12;
    Round(a,uVar5,uVar9,&d,e,uVar3,uVar2,&local_150,0xd807aa98,uVar12);
    uVar10 = d;
    uVar1 = local_150;
    uVar12 = local_e8[9];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_88 = (ulong)uVar12;
    Round(local_150,uVar6,uVar5,&c,d,uVar4,uVar3,&g,0x12835b01,uVar12);
    uVar9 = c;
    uVar2 = g;
    uVar12 = local_e8[10];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_98 = (ulong)uVar12;
    Round(g,uVar1,uVar6,&b,c,uVar10,uVar4,&f,0x243185be,uVar12);
    uVar5 = b;
    uVar3 = f;
    uVar12 = local_e8[0xb];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_a0 = (ulong)uVar12;
    Round(f,uVar2,uVar1,&a,b,uVar9,uVar10,&e,0x550c7dc3,uVar12);
    uVar6 = a;
    uVar4 = e;
    local_c8 = (ulong)a;
    uVar12 = local_e8[0xc];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_a8 = (ulong)uVar12;
    Round(e,uVar3,uVar2,&local_150,a,uVar5,uVar9,&d,0x72be5d74,uVar12);
    uVar10 = d;
    uVar1 = local_150;
    uVar12 = local_e8[0xd];
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_90 = (ulong)uVar12;
    Round(d,uVar4,uVar3,&g,local_150,uVar6,uVar5,&c,0x80deb1fe,uVar12);
    uVar9 = c;
    uVar2 = g;
    local_120 = (ulong)g;
    uVar12 = local_e8[0xe];
    uVar11 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
    uVar8 = uVar11 | uVar12 << 0x18;
    local_118._0_4_ = c;
    Round(c,uVar10,uVar4,&f,g,uVar1,(uint32_t)local_c8,&b,0x9bdc06a7,uVar8);
    uVar3 = f;
    local_124 = b;
    uVar12 = local_e8[0xf];
    uVar7 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
    uVar14 = uVar7 | uVar12 << 0x18;
    Round(b,uVar9,uVar10,&e,f,uVar2,uVar1,&a,0xc19bf174,uVar14);
    uVar10 = local_124;
    uVar4 = a;
    uVar1 = e;
    uVar12 = (uint)local_108;
    local_130 = (ulong)e;
    uVar13 = (int)local_b8 + (int)local_88 +
             ((uint)(local_108 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) +
             (uVar8 >> 10 ^ (uVar11 << 0xd | uVar8 >> 0x13) ^ (uVar11 << 0xf | uVar8 >> 0x11));
    local_110._0_4_ = a;
    local_b0 = (ulong)uVar8;
    Round(a,local_124,(uint32_t)local_118,&d,e,uVar3,(uint32_t)local_120,&local_150,0xe49b69c1,
          uVar13);
    uVar2 = d;
    local_120._0_4_ = local_150;
    uVar11 = (uint)local_100;
    uVar12 = (int)local_108 + (int)local_98 +
             ((uint)(local_100 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) +
             (uVar14 >> 10 ^ (uVar7 << 0xd | uVar14 >> 0x13) ^ (uVar7 << 0xf | uVar14 >> 0x11));
    local_c8 = (ulong)uVar14;
    Round(local_150,uVar4,uVar10,&c,d,uVar1,uVar3,&g,0xefbe4786,uVar12);
    uVar1 = (uint32_t)local_120;
    uVar3 = c;
    local_118._0_4_ = g;
    uVar8 = (uint)local_f0;
    uVar11 = uVar11 + (int)local_a0 +
             ((uint)(local_f0 >> 3) & 0x1fffffff ^
             (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7)) +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_b8 = (ulong)uVar13;
    Round(g,(uint32_t)local_120,(uint32_t)local_110,&b,c,uVar2,(uint32_t)local_130,&f,0xfc19dc6,
          uVar11);
    uVar10 = (uint32_t)local_118;
    local_124 = f;
    uVar7 = (uint)local_d8;
    local_130 = (ulong)b;
    uVar7 = uVar8 + (int)local_a8 +
            ((uint)(local_d8 >> 3) & 0x1fffffff ^
            (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_108 = (ulong)uVar12;
    Round(f,(uint32_t)local_118,uVar1,&a,b,uVar3,uVar2,&e,0x240ca1cc,uVar7);
    uVar4 = local_124;
    uVar1 = e;
    uVar12 = (uint)local_c0;
    local_80 = (ulong)a;
    uVar12 = (int)local_d8 + (int)local_90 +
             ((uint)(local_c0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    local_d8 = (ulong)uVar12;
    local_110 = CONCAT44(local_110._4_4_,e);
    uVar9 = (uint32_t)local_130;
    local_100 = (ulong)uVar11;
    Round(e,local_124,uVar10,&local_150,a,uVar9,uVar3,&d,0x2de92c6f,uVar12);
    uVar2 = d;
    uVar11 = (uint)local_f8;
    local_58 = (ulong)local_150;
    uVar8 = (int)local_c0 + (int)local_b0 +
            ((uint)(local_f8 >> 3) & 0x1fffffff ^
            (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) +
            (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_120 = CONCAT44(local_120._4_4_,d);
    uVar10 = (uint32_t)local_80;
    local_f0 = (ulong)uVar7;
    Round(d,uVar1,uVar4,&g,local_150,uVar10,uVar9,&c,0x4a7484aa,uVar8);
    uVar3 = c;
    uVar1 = g;
    uVar12 = (uint)local_d8;
    uVar7 = (uint)local_e0;
    local_130 = (ulong)g;
    uVar12 = uVar11 + (int)local_c8 +
             ((uint)(local_e0 >> 3) & 0x1fffffff ^
             (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) +
             ((uint)(local_d8 >> 10) & 0x3fffff ^
             (uVar12 << 0xd | uVar12 >> 0x13) ^ (uVar12 << 0xf | uVar12 >> 0x11));
    local_118 = CONCAT44(local_118._4_4_,c);
    uVar9 = (uint32_t)local_58;
    Round(c,uVar2,(uint32_t)local_110,&f,g,uVar9,uVar10,&b,0x5cb0a9dc,uVar12);
    uVar4 = b;
    uVar2 = f;
    uVar11 = (uint)local_d0;
    local_110 = (ulong)f;
    uVar13 = ((uint)(local_d0 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (uint32_t)local_e0
             + (int)local_b8 +
             (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    local_124 = b;
    local_c0 = (ulong)uVar8;
    Round(b,uVar3,(uint32_t)local_120,&e,f,uVar1,uVar9,&a,0x76f988da,uVar13);
    uVar9 = a;
    uVar3 = e;
    uVar7 = (uint)local_88;
    local_120 = (ulong)e;
    uVar11 = ((uint)(local_88 >> 3) & 0x1fffffff ^
             (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + (uint32_t)local_d0 +
             (int)local_108 +
             (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11)
             );
    local_f8 = (ulong)uVar12;
    Round(a,uVar4,(uint32_t)local_118,&d,e,uVar2,(uint32_t)local_130,&local_150,0x983e5152,uVar11);
    uVar4 = d;
    uVar1 = local_150;
    uVar12 = (uint)local_98;
    local_118 = (ulong)d;
    uVar8 = ((uint)(local_98 >> 3) & 0x1fffffff ^
            (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + uVar7 +
            (uint32_t)local_100 +
            (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11))
    ;
    local_e0 = (ulong)uVar13;
    Round(local_150,uVar9,local_124,&c,d,uVar3,(uint32_t)local_110,&g,0xa831c66d,uVar8);
    uVar10 = c;
    uVar2 = g;
    uVar12 = (uint)local_a0;
    local_110 = (ulong)c;
    uVar7 = ((uint)(local_a0 >> 3) & 0x1fffffff ^
            (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_98 +
            (int)local_f0 +
            (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11))
    ;
    local_124 = g;
    local_d0 = (ulong)uVar11;
    Round(g,uVar1,uVar9,&b,c,uVar4,(uint32_t)local_120,&f,0xb00327c8,uVar7);
    uVar9 = b;
    uVar3 = f;
    uVar12 = (uint)local_a8;
    local_130 = (ulong)b;
    uVar12 = ((uint)(local_a8 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_a0 +
             (int)local_d8 +
             (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    local_88 = (ulong)uVar8;
    Round(f,uVar2,uVar1,&a,b,uVar10,(uint32_t)local_118,&e,0xbf597fc7,uVar12);
    uVar2 = a;
    uVar4 = e;
    uVar11 = (uint)local_90;
    local_118 = (ulong)a;
    uVar11 = ((uint)(local_90 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_a8 +
             (int)local_c0 +
             (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_98 = (ulong)uVar7;
    Round(e,uVar3,local_124,&local_150,a,uVar9,(uint32_t)local_110,&d,0xc6e00bf3,uVar11);
    uVar10 = d;
    uVar1 = local_150;
    uVar7 = (uint)local_b0;
    local_120 = (ulong)local_150;
    uVar7 = ((uint)(local_b0 >> 3) & 0x1fffffff ^
            (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + (int)local_90 +
            (uint32_t)local_f8 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_124 = d;
    local_a0 = (ulong)uVar12;
    Round(d,uVar4,uVar3,&g,local_150,uVar2,(uint32_t)local_130,&c,0xd5a79147,uVar7);
    uVar3 = c;
    uVar2 = g;
    uVar12 = (uint)local_c8;
    local_130 = (ulong)g;
    uVar12 = ((uint)(local_c8 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_b0 +
             (uint32_t)local_e0 +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    local_a8 = (ulong)uVar11;
    Round(c,uVar10,uVar4,&f,g,uVar1,(uint32_t)local_118,&b,0x6ca6351,uVar12);
    uVar4 = b;
    uVar1 = f;
    uVar11 = (uint)local_b8;
    local_110 = (ulong)f;
    uVar8 = ((uint)(local_b8 >> 3) & 0x1fffffff ^
            (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_c8 +
            (uint32_t)local_d0 +
            (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_90 = (ulong)uVar7;
    Round(b,uVar3,local_124,&e,f,uVar2,(uint32_t)local_120,&a,0x14292967,uVar8);
    uVar10 = a;
    uVar2 = e;
    uVar11 = (uint)local_108;
    local_120 = (ulong)e;
    uVar7 = ((uint)(local_108 >> 3) & 0x1fffffff ^
            (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_b8 +
            (int)local_88 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_118._0_4_ = a;
    local_b0 = (ulong)uVar12;
    Round(a,uVar4,uVar3,&d,e,uVar1,(uint32_t)local_130,&local_150,0x27b70a85,uVar7);
    uVar3 = d;
    uVar1 = local_150;
    uVar12 = (uint)local_100;
    local_130 = (ulong)d;
    uVar12 = ((uint)(local_100 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_108 +
             (int)local_98 +
             (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    local_c8 = (ulong)uVar8;
    Round(local_150,uVar10,uVar4,&c,d,uVar2,(uint32_t)local_110,&g,0x2e1b2138,uVar12);
    uVar4 = c;
    uVar2 = g;
    uVar11 = (uint)local_f0;
    local_110 = (ulong)c;
    uVar11 = ((uint)(local_f0 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) +
             (uint32_t)local_100 + (int)local_a0 +
             (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_b8 = (ulong)uVar7;
    Round(g,uVar1,(uint32_t)local_118,&b,c,uVar3,(uint32_t)local_120,&f,0x4d2c6dfc,uVar11);
    uVar10 = b;
    uVar3 = f;
    uVar7 = (uint)local_d8;
    local_120 = (ulong)b;
    uVar7 = ((uint)(local_d8 >> 3) & 0x1fffffff ^
            (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + (int)local_f0 +
            (int)local_a8 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_118._0_4_ = f;
    local_108 = (ulong)uVar12;
    Round(f,uVar2,uVar1,&a,b,uVar4,(uint32_t)local_130,&e,0x53380d13,uVar7);
    uVar9 = a;
    uVar4 = e;
    uVar12 = (uint)local_c0;
    local_130 = (ulong)a;
    uVar12 = ((uint)(local_c0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_d8 +
             (int)local_90 +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    local_100 = (ulong)uVar11;
    Round(e,uVar3,uVar2,&local_150,a,uVar10,(uint32_t)local_110,&d,0x650a7354,uVar12);
    uVar3 = d;
    uVar1 = local_150;
    uVar11 = (uint)local_f8;
    local_110 = (ulong)local_150;
    uVar8 = ((uint)(local_f8 >> 3) & 0x1fffffff ^
            (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_c0 +
            (int)local_b0 +
            (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_f0 = (ulong)uVar7;
    Round(d,uVar4,(uint32_t)local_118,&g,local_150,uVar9,(uint32_t)local_120,&c,0x766a0abb,uVar8);
    uVar10 = c;
    uVar2 = g;
    uVar11 = (uint)local_e0;
    local_120 = (ulong)g;
    uVar7 = ((uint)(local_e0 >> 3) & 0x1fffffff ^
            (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (uint32_t)local_f8
            + (int)local_c8 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_118._0_4_ = c;
    local_d8 = (ulong)uVar12;
    Round(c,uVar3,uVar4,&f,g,uVar1,(uint32_t)local_130,&b,0x81c2c92e,uVar7);
    uVar9 = b;
    uVar1 = f;
    uVar12 = (uint)local_d0;
    local_130 = (ulong)f;
    uVar12 = ((uint)(local_d0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (uint32_t)local_e0
             + (int)local_b8 +
             (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    local_c0 = (ulong)uVar8;
    Round(b,uVar10,uVar3,&e,f,uVar2,(uint32_t)local_110,&a,0x92722c85,uVar12);
    uVar3 = a;
    uVar2 = e;
    uVar11 = (uint)local_88;
    local_110 = (ulong)e;
    uVar11 = ((uint)(local_88 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (uint32_t)local_d0
             + (int)local_108 +
             (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_f8 = (ulong)uVar7;
    Round(a,uVar9,(uint32_t)local_118,&d,e,uVar1,(uint32_t)local_120,&local_150,0xa2bfe8a1,uVar11);
    uVar4 = d;
    uVar1 = local_150;
    uVar7 = (uint)local_98;
    uVar7 = ((uint)(local_98 >> 3) & 0x1fffffff ^
            (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + (int)local_88 +
            (uint32_t)local_100 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_120 = CONCAT44(local_120._4_4_,local_150);
    local_e0 = (ulong)uVar12;
    Round(local_150,uVar3,uVar9,&c,d,uVar2,(uint32_t)local_130,&g,0xa81a664b,uVar7);
    uVar10 = c;
    uVar2 = g;
    uVar12 = (uint)local_a0;
    local_130 = (ulong)c;
    uVar12 = ((uint)(local_a0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_98 +
             (int)local_f0 +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    local_118 = CONCAT44(local_118._4_4_,g);
    local_d0 = (ulong)uVar11;
    Round(g,uVar1,uVar3,&b,c,uVar4,(uint32_t)local_110,&f,0xc24b8b70,uVar12);
    uVar1 = b;
    uVar3 = f;
    uVar11 = (uint)local_a8;
    local_110 = (ulong)b;
    uVar8 = ((uint)(local_a8 >> 3) & 0x1fffffff ^
            (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_a0 +
            (int)local_d8 +
            (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_88 = (ulong)uVar7;
    Round(f,uVar2,(uint32_t)local_120,&a,b,uVar10,uVar4,&e,0xc76c51a3,uVar8);
    uVar2 = a;
    uVar4 = e;
    uVar11 = (uint)local_90;
    local_120 = (ulong)a;
    uVar11 = ((uint)(local_90 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_a8 +
             (int)local_c0 +
             (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11)
             );
    local_98 = (ulong)uVar12;
    Round(e,uVar3,(uint32_t)local_118,&local_150,a,uVar1,(uint32_t)local_130,&d,0xd192e819,uVar11);
    uVar10 = d;
    uVar1 = local_150;
    uVar12 = (uint)local_b0;
    local_130 = (ulong)local_150;
    uVar7 = ((uint)(local_b0 >> 3) & 0x1fffffff ^
            (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_90 +
            (uint32_t)local_f8 +
            (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    local_124 = d;
    local_a0 = (ulong)uVar8;
    Round(d,uVar4,uVar3,&g,local_150,uVar2,(uint32_t)local_110,&c,0xd6990624,uVar7);
    uVar3 = c;
    uVar2 = g;
    uVar12 = (uint)local_c8;
    local_110 = (ulong)g;
    uVar12 = ((uint)(local_c8 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_b0 +
             (uint32_t)local_e0 +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    local_a8 = (ulong)uVar11;
    Round(c,uVar10,uVar4,&f,g,uVar1,(uint32_t)local_120,&b,0xf40e3585,uVar12);
    uVar4 = b;
    uVar1 = f;
    uVar11 = (uint)local_b8;
    local_118 = (ulong)f;
    uVar11 = ((uint)(local_b8 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_c8 +
             (uint32_t)local_d0 +
             (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    local_80._0_4_ = b;
    local_90 = (ulong)uVar7;
    Round(b,uVar3,local_124,&e,f,uVar2,(uint32_t)local_130,&a,0x106aa070,uVar11);
    uVar2 = e;
    local_124 = a;
    uVar7 = (uint)local_108;
    local_120 = (ulong)e;
    uVar8 = ((uint)(local_108 >> 3) & 0x1fffffff ^
            (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + (int)local_b8 +
            (int)local_88 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
    ;
    local_b0 = (ulong)uVar12;
    Round(a,uVar4,uVar3,&d,e,uVar1,(uint32_t)local_110,&local_150,0x19a4c116,uVar8);
    uVar3 = local_124;
    uVar1 = local_150;
    uVar12 = (uint)local_100;
    local_130 = (ulong)d;
    uVar7 = ((uint)(local_100 >> 3) & 0x1fffffff ^
            (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_108 +
            (int)local_98 +
            (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11))
    ;
    local_c8 = (ulong)uVar11;
    Round(local_150,local_124,(uint32_t)local_80,&c,d,uVar2,(uint32_t)local_118,&g,0x1e376c08,uVar7)
    ;
    uVar2 = c;
    local_80 = CONCAT44(local_80._4_4_,g);
    uVar12 = (uint)local_f0;
    local_108 = (ulong)c;
    uVar13 = ((uint)(local_f0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) +
             (uint32_t)local_100 + (int)local_a0 +
             (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    local_b8 = (ulong)uVar8;
    Round(g,uVar1,uVar3,&b,c,(uint32_t)local_130,(uint32_t)local_120,&f,0x2748774c,uVar13);
    uVar3 = b;
    local_100._0_4_ = f;
    uVar12 = (uint)local_d8;
    local_110 = (ulong)b;
    uVar8 = ((uint)(local_d8 >> 3) & 0x1fffffff ^
            (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_f0 +
            (int)local_a8 +
            (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    uVar4 = (uint32_t)local_80;
    Round(f,(uint32_t)local_80,uVar1,&a,b,uVar2,(uint32_t)local_130,&e,0x34b0bcb5,uVar8);
    uVar1 = a;
    local_130._0_4_ = e;
    uVar12 = (uint)local_c0;
    local_118 = (ulong)a;
    w = ((uint)(local_c0 >> 3) & 0x1fffffff ^
        (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_d8 +
        (int)local_90 +
        (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
    Round(e,(uint32_t)local_100,uVar4,&local_150,a,uVar3,(uint32_t)local_108,&d,0x391c0cb3,w);
    local_120 = CONCAT44(local_120._4_4_,d);
    uVar12 = (uint)local_f8;
    local_108 = (ulong)local_150;
    w_00 = ((uint)(local_f8 >> 3) & 0x1fffffff ^
           (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_c0 +
           (int)local_b0 +
           (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
    Round(d,(uint32_t)local_130,(uint32_t)local_100,&g,local_150,uVar1,(uint32_t)local_110,&c,
          0x4ed8aa4a,w_00);
    local_100._0_4_ = c;
    uVar12 = (uint)local_e0;
    local_f0 = (ulong)g;
    uVar14 = ((uint)(local_e0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (uint32_t)local_f8
             + (int)local_c8 + (w >> 10 ^ (w * 0x2000 | w >> 0x13) ^ (w * 0x8000 | w >> 0x11));
    Round(c,(uint32_t)local_120,(uint32_t)local_130,&f,g,(uint32_t)local_108,(uint32_t)local_118,&b,
          0x5b9cca4f,uVar14);
    local_130 = CONCAT44(local_130._4_4_,b);
    uVar12 = (uint)local_d0;
    local_f8 = (ulong)f;
    uVar12 = ((uint)(local_d0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (uint32_t)local_e0
             + (int)local_b8 +
             (w_00 >> 10 ^ (w_00 * 0x2000 | w_00 >> 0x13) ^ (w_00 * 0x8000 | w_00 >> 0x11));
    local_d8 = (ulong)uVar12;
    Round(b,(uint32_t)local_100,(uint32_t)local_120,&e,f,(uint32_t)local_f0,(uint32_t)local_108,&a,
          0x682e6ff3,uVar12);
    local_e0._0_4_ = a;
    uVar12 = (uint)local_88;
    local_108 = (ulong)e;
    uVar12 = ((uint)(local_88 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (uint32_t)local_d0
             + uVar7 + (uVar14 >> 10 ^
                       (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
    local_c0 = (ulong)uVar12;
    Round(a,(uint32_t)local_130,(uint32_t)local_100,&d,e,(uint32_t)local_f8,(uint32_t)local_f0,
          &local_150,0x748f82ee,uVar12);
    local_100 = CONCAT44(local_100._4_4_,local_150);
    uVar12 = (uint)local_d8;
    uVar11 = (uint)local_98;
    local_f0 = (ulong)d;
    uVar11 = ((uint)(local_98 >> 3) & 0x1fffffff ^
             (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) + (int)local_88 +
             uVar13 + ((uint)(local_d8 >> 10) & 0x3fffff ^
                      (uVar12 << 0xd | uVar12 >> 0x13) ^ (uVar12 << 0xf | uVar12 >> 0x11));
    Round(local_150,(uint32_t)local_e0,(uint32_t)local_130,&c,d,(uint32_t)local_108,
          (uint32_t)local_f8,&g,0x78a5636f,uVar11);
    local_d0 = CONCAT44(local_d0._4_4_,g);
    uVar12 = (uint)local_c0;
    uVar7 = (uint)local_a0;
    local_f8 = (ulong)c;
    uVar7 = ((uint)(local_a0 >> 3) & 0x1fffffff ^
            (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + (int)local_98 + uVar8 +
            ((uint)(local_c0 >> 10) & 0x3fffff ^
            (uVar12 << 0xd | uVar12 >> 0x13) ^ (uVar12 << 0xf | uVar12 >> 0x11));
    Round(g,(uint32_t)local_100,(uint32_t)local_e0,&b,c,(uint32_t)local_f0,(uint32_t)local_108,&f,
          0x84c87814,uVar7);
    uVar1 = f;
    uVar12 = (uint)local_a8;
    local_108 = (ulong)b;
    uVar11 = ((uint)(local_a8 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_a0 + w
             + (uVar11 >> 10 ^
               (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
    local_e0 = CONCAT44(local_e0._4_4_,f);
    Round(f,(uint32_t)local_d0,(uint32_t)local_100,&a,b,(uint32_t)local_f8,(uint32_t)local_f0,&e,
          0x8cc70208,uVar11);
    uVar2 = a;
    uVar3 = e;
    uVar12 = (uint)local_90;
    local_f0 = (ulong)a;
    uVar7 = ((uint)(local_90 >> 3) & 0x1fffffff ^
            (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_a8 +
            w_00 + (uVar7 >> 10 ^
                   (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
    Round(e,uVar1,(uint32_t)local_d0,&local_150,a,(uint32_t)local_108,(uint32_t)local_f8,&d,
          0x90befffa,uVar7);
    uVar1 = local_150;
    local_f8 = CONCAT44(local_f8._4_4_,d);
    uVar12 = (uint)local_b0;
    uVar11 = ((uint)(local_b0 >> 3) & 0x1fffffff ^
             (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_90 +
             uVar14 + (uVar11 >> 10 ^
                      (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
    Round(d,uVar3,(uint32_t)local_e0,&g,local_150,uVar2,(uint32_t)local_108,&c,0xa4506ceb,uVar11);
    uVar4 = c;
    uVar2 = g;
    uVar12 = (uint)local_c8;
    Round(c,(uint32_t)local_f8,uVar3,&f,g,uVar1,(uint32_t)local_f0,&b,0xbef9a3f7,
          ((uint)(local_c8 >> 3) & 0x1fffffff ^
          (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_b0 +
          (int)local_d8 +
          (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11)));
    uVar10 = b;
    uVar3 = f;
    uVar12 = (uint)local_b8;
    uVar9 = (uint32_t)local_f8;
    Round(b,uVar4,(uint32_t)local_f8,&e,f,uVar2,uVar1,&a,0xc67178f2,
          ((uint)(local_b8 >> 3) & 0x1fffffff ^
          (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) + (int)local_c8 +
          (int)local_c0 +
          (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)));
    *local_60 = local_74 + a;
    local_60[1] = uVar10 + local_70;
    local_60[2] = uVar4 + local_6c;
    local_60[3] = uVar9 + local_68;
    local_60[4] = (int)local_50 + e;
    local_60[5] = uVar3 + (int)local_48;
    local_60[6] = uVar2 + (int)local_40;
    local_60[7] = uVar1 + local_64;
    chunk = local_e8 + 0x10;
  }
  return;
}

Assistant:

static inline void Transform(uint32_t *s, const uint32_t *chunk, size_t blocks)
{
#if defined(__x86_64__) || defined(__amd64__)
	if (use_optimized_transform) {
		TransformSSE4(s, chunk, blocks);
		return;
	}
#endif
	TransformDefault(s, chunk, blocks);
}